

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# name-tree.c
# Opt level: O2

nametree_entry_t *
ndn_nametree_prefix_match
          (ndn_nametree_t *nametree,uint8_t *name,size_t len,NDN_NAMETREE_ENTRY_TYPE type)

{
  ndn_nametree_t *__s2;
  ushort uVar1;
  long lVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  size_t __n;
  nametree_entry_t *pnVar7;
  uint local_34;
  
  pnVar7 = (nametree_entry_t *)0x0;
  if (1 < len) {
    local_34 = 0xffff;
    for (uVar5 = (ulong)(0xfc < name[1]) * 2 + 2; uVar5 < len; uVar5 = uVar5 + uVar6) {
      uVar6 = (ulong)name[uVar5 + 1] + 2;
      __n = 0x24;
      if (uVar6 < 0x24) {
        __n = uVar6;
      }
      lVar2 = (long)pnVar7 * 0x2e + 0x26;
      do {
        uVar1 = *(ushort *)(nametree + lVar2);
        pnVar7 = (nametree_entry_t *)(ulong)uVar1;
        if (pnVar7 == (nametree_entry_t *)0xffff) goto LAB_0010238d;
        __s2 = nametree + (long)pnVar7 * 0x2e;
        iVar3 = memcmp(name + uVar5,__s2,__n);
        lVar2 = (long)pnVar7 * 0x2e + 0x28;
      } while (0 < iVar3);
      if (iVar3 != 0) break;
      uVar4 = local_34;
      if (*(short *)(__s2 + 0x2c) != -1) {
        uVar4 = (uint)uVar1;
      }
      if (type != NDN_NAMETREE_FIB_TYPE) {
        uVar4 = local_34;
      }
      local_34 = uVar4;
      if (*(short *)(__s2 + 0x2a) != -1) {
        local_34 = (uint)uVar1;
      }
      if (type != NDN_NAMETREE_PIT_TYPE) {
        local_34 = uVar4;
      }
    }
LAB_0010238d:
    if (local_34 == 0xffff) {
      pnVar7 = (nametree_entry_t *)0x0;
    }
    else {
      pnVar7 = (nametree_entry_t *)(nametree + (ulong)local_34 * 0x2e);
    }
  }
  return pnVar7;
}

Assistant:

nametree_entry_t*
ndn_nametree_prefix_match(
                          ndn_nametree_t* nametree,
                          uint8_t name[],
                          size_t len,
                          enum NDN_NAMETREE_ENTRY_TYPE type)
{
  int now_node, last_node = NDN_INVALID_ID , father = 0 , tmp;
  size_t component_len, eqiv_component_len, offset = 0;
  if (len < 2) return NULL;
  if (name[1] < 253) offset = 2; else offset = 4;
  while (offset < len) {
    component_len = name[offset + 1] + 2;
    eqiv_component_len = minof2(component_len, NDN_NAME_COMPONENT_BUFFER_SIZE);
    now_node = (*nametree)[father].left_child;
    tmp = -2;
    while (now_node != NDN_INVALID_ID) {
      tmp = memcmp(name+offset,(*nametree)[now_node].val , eqiv_component_len);
      if (tmp <= 0) break;
      now_node = (*nametree)[now_node].right_bro;
    }
    if (tmp == 0) {
      if ((*nametree)[now_node].fib_id != NDN_INVALID_ID && type == NDN_NAMETREE_FIB_TYPE) last_node = now_node;
      if ((*nametree)[now_node].pit_id != NDN_INVALID_ID && type == NDN_NAMETREE_PIT_TYPE) last_node = now_node;
    } else break;
    offset += component_len;
    father = now_node;
  }
  if (last_node == NDN_INVALID_ID) return NULL; else return &(*nametree)[last_node];
}